

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_UTCTIME_print(BIO *fp,ASN1_UTCTIME *a)

{
  int iVar1;
  undefined1 local_68 [8];
  tm utc;
  CBS cbs;
  ASN1_UTCTIME *tm_local;
  BIO *bp_local;
  
  CBS_init((CBS *)&utc.tm_zone,a->data,(long)a->length);
  iVar1 = CBS_parse_utc_time((CBS *)&utc.tm_zone,(tm *)local_68,0);
  if (iVar1 == 0) {
    BIO_puts(fp,"Bad time value");
    bp_local._4_4_ = 0;
  }
  else {
    iVar1 = BIO_printf(fp,"%s %2d %02d:%02d:%02d %d GMT",mon[utc.tm_hour],(ulong)(uint)utc.tm_min,
                       (ulong)(uint)utc.tm_sec,(ulong)(uint)local_68._4_4_,local_68._0_4_,
                       utc.tm_mday + 0x76c);
    bp_local._4_4_ = (uint)(0 < iVar1);
  }
  return bp_local._4_4_;
}

Assistant:

int ASN1_UTCTIME_print(BIO *bp, const ASN1_UTCTIME *tm) {
  CBS cbs;
  CBS_init(&cbs, tm->data, tm->length);
  struct tm utc;
  if (!CBS_parse_utc_time(&cbs, &utc, /*allow_timezone_offset=*/0)) {
    BIO_puts(bp, "Bad time value");
    return 0;
  }

  return BIO_printf(bp, "%s %2d %02d:%02d:%02d %d GMT", mon[utc.tm_mon],
                    utc.tm_mday, utc.tm_hour, utc.tm_min, utc.tm_sec,
                    utc.tm_year + 1900) > 0;
}